

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateTableRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateTableRelation *this,idx_t depth)

{
  Relation *pRVar1;
  string str;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_60,(Relation *)depth,depth);
  ::std::operator+(&local_40,&local_60,"Create Table\n");
  ::std::__cxx11::string::~string((string *)&local_60);
  pRVar1 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar1->_vptr_Relation[6])(&local_60,pRVar1,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_40,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string CreateTableRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Create Table\n";
	return str + child->ToString(depth + 1);
}